

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  U32 UVar11;
  U32 UVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  size_t sVar15;
  size_t sVar16;
  bool bVar17;
  uint local_94c;
  uint local_948;
  uint local_87c;
  uint local_878;
  uint local_7ac;
  uint local_7a8;
  uint local_6dc;
  uint local_6d8;
  U32 mls;
  ZSTD_compressionParameters *cParams;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  U32 offset_9;
  U32 offset_8;
  BYTE *dictMatch_3;
  U32 dictMatchIndex_3;
  size_t dictHash_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_558;
  U32 repIndex_3;
  BYTE *match_3;
  U32 matchIndex_3;
  U32 current_3;
  size_t h_3;
  size_t mLength_3;
  U32 maxRep_3;
  U32 dictHLog_3;
  U32 dictAndPrefixLength_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashTable_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  uint local_4e8;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixStart_3;
  BYTE *pBStack_4c0;
  U32 prefixStartIndex_3;
  BYTE *anchor_3;
  BYTE *ip_3;
  BYTE *istart_3;
  BYTE *base_3;
  U32 stepSize_3;
  U32 hlog_3;
  U32 *hashTable_3;
  ZSTD_compressionParameters *cParams_4;
  U32 tmpOff_2;
  size_t rLength_2;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  U32 offset_7;
  U32 offset_6;
  BYTE *dictMatch_2;
  U32 dictMatchIndex_2;
  size_t dictHash_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_3e8;
  U32 repIndex_2;
  BYTE *match_2;
  U32 matchIndex_2;
  U32 current_2;
  size_t h_2;
  size_t mLength_2;
  U32 maxRep_2;
  U32 dictHLog_2;
  U32 dictAndPrefixLength_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashTable_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  uint local_378;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixStart_2;
  BYTE *pBStack_350;
  U32 prefixStartIndex_2;
  BYTE *anchor_2;
  BYTE *ip_2;
  BYTE *istart_2;
  BYTE *base_2;
  U32 stepSize_2;
  U32 hlog_2;
  U32 *hashTable_2;
  ZSTD_compressionParameters *cParams_3;
  U32 tmpOff_1;
  size_t rLength_1;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 offset_5;
  U32 offset_4;
  BYTE *dictMatch_1;
  U32 dictMatchIndex_1;
  size_t dictHash_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_278;
  U32 repIndex_1;
  BYTE *match_1;
  U32 matchIndex_1;
  U32 current_1;
  size_t h_1;
  size_t mLength_1;
  U32 maxRep_1;
  U32 dictHLog_1;
  U32 dictAndPrefixLength_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashTable_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  uint local_208;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixStart_1;
  BYTE *pBStack_1e0;
  U32 prefixStartIndex_1;
  BYTE *anchor_1;
  BYTE *ip_1;
  BYTE *istart_1;
  BYTE *base_1;
  U32 stepSize_1;
  U32 hlog_1;
  U32 *hashTable_1;
  ZSTD_compressionParameters *cParams_2;
  U32 tmpOff;
  size_t rLength;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 offset_3;
  U32 offset;
  BYTE *dictMatch;
  U32 dictMatchIndex;
  size_t dictHash;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_108;
  U32 repIndex;
  BYTE *match;
  U32 matchIndex;
  U32 current;
  size_t h;
  size_t mLength;
  U32 maxRep;
  U32 dictHLog;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashTable;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  uint local_98;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixStart;
  BYTE *pBStack_70;
  U32 prefixStartIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams_1;
  
  iVar7 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar8 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar5 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar13 = (BYTE *)((long)src + srcSize);
    pBVar14 = pBVar13 + -8;
    uVar3 = *rep;
    uVar10 = rep[1];
    dms._4_4_ = 0;
    iVar6 = (int)(pBVar5 + uVar2);
    anchor = (BYTE *)((long)src + (long)(int)(uint)(iVar7 == iVar6));
    uVar9 = (int)anchor - iVar6;
    local_98 = uVar10;
    if (uVar9 < uVar10) {
      local_98 = 0;
      dms._4_4_ = uVar10;
    }
    offsetSaved = uVar3;
    pBStack_70 = (BYTE *)src;
    if (uVar9 < uVar3) {
      offsetSaved = 0;
      dms._4_4_ = uVar3;
    }
    while (anchor < pBVar14) {
      sVar15 = ZSTD_hashPtr(anchor,UVar1,4);
      iVar7 = (int)pBVar5;
      uVar10 = (int)anchor - iVar7;
      uVar3 = pUVar4[sVar15];
      pBStack_108 = pBVar5 + uVar3;
      pUVar4[sVar15] = uVar10;
      UVar11 = MEM_read32(anchor + (1 - (ulong)offsetSaved));
      UVar12 = MEM_read32(anchor + 1);
      if (offsetSaved == 0 || UVar11 != UVar12) {
        if (uVar2 < uVar3) {
          UVar11 = MEM_read32(pBStack_108);
          UVar12 = MEM_read32(anchor);
          if (UVar11 == UVar12) {
            UVar11 = (int)anchor - (int)pBStack_108;
            sVar15 = ZSTD_count(anchor + 4,pBStack_108 + 4,pBVar13);
            h = sVar15 + 4;
            while( true ) {
              bVar17 = false;
              if (pBStack_70 < anchor && pBVar5 + uVar2 < pBStack_108) {
                bVar17 = anchor[-1] == pBStack_108[-1];
              }
              if (!bVar17) break;
              anchor = anchor + -1;
              pBStack_108 = pBStack_108 + -1;
              h = h + 1;
            }
            ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_70,pBStack_70,UVar11 + 2,h - 3);
            local_98 = offsetSaved;
            offsetSaved = UVar11;
            goto LAB_0069c222;
          }
          anchor = anchor + ((long)anchor - (long)pBStack_70 >> 8) + (ulong)uVar8;
        }
        else {
          anchor = anchor + ((long)anchor - (long)pBStack_70 >> 8) + (ulong)uVar8;
        }
      }
      else {
        sVar15 = ZSTD_count(anchor + 5,anchor + (5 - (ulong)offsetSaved),pBVar13);
        h = sVar15 + 4;
        anchor = anchor + 1;
        ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_70,pBStack_70,0,sVar15 + 1);
LAB_0069c222:
        pBStack_70 = anchor + h;
        anchor = pBStack_70;
        if (pBStack_70 <= pBVar14) {
          sVar15 = ZSTD_hashPtr(pBVar5 + (ulong)uVar10 + 2,UVar1,4);
          pUVar4[sVar15] = uVar10 + 2;
          sVar15 = ZSTD_hashPtr(pBStack_70 + -2,UVar1,4);
          pUVar4[sVar15] = ((int)pBStack_70 + -2) - iVar7;
          while( true ) {
            uVar3 = local_98;
            bVar17 = false;
            if (anchor <= pBVar14) {
              UVar11 = MEM_read32(anchor);
              UVar12 = MEM_read32(anchor + -(ulong)local_98);
              bVar17 = local_98 != 0 && UVar11 == UVar12;
            }
            pBStack_70 = anchor;
            if (!bVar17) break;
            sVar15 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)local_98),pBVar13);
            local_98 = offsetSaved;
            offsetSaved = uVar3;
            sVar16 = ZSTD_hashPtr(anchor,UVar1,4);
            pUVar4[sVar16] = (int)anchor - iVar7;
            ZSTD_storeSeq(seqStore,0,anchor,0,sVar15 + 1);
            anchor = anchor + sVar15 + 4;
          }
        }
      }
    }
    if (offsetSaved == 0) {
      local_6d8 = dms._4_4_;
    }
    else {
      local_6d8 = offsetSaved;
    }
    *rep = local_6d8;
    if (local_98 == 0) {
      local_6dc = dms._4_4_;
    }
    else {
      local_6dc = local_98;
    }
    rep[1] = local_6dc;
    ms_local = (ZSTD_matchState_t *)(pBVar13 + -(long)pBStack_70);
    break;
  case 5:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar8 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar5 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar13 = (BYTE *)((long)src + srcSize);
    pBVar14 = pBVar13 + -8;
    uVar3 = *rep;
    uVar10 = rep[1];
    dms_1._4_4_ = 0;
    iVar6 = (int)(pBVar5 + uVar2);
    anchor_1 = (BYTE *)((long)src + (long)(int)(uint)(iVar7 == iVar6));
    uVar9 = (int)anchor_1 - iVar6;
    local_208 = uVar10;
    if (uVar9 < uVar10) {
      local_208 = 0;
      dms_1._4_4_ = uVar10;
    }
    offsetSaved_1 = uVar3;
    pBStack_1e0 = (BYTE *)src;
    if (uVar9 < uVar3) {
      offsetSaved_1 = 0;
      dms_1._4_4_ = uVar3;
    }
    while (anchor_1 < pBVar14) {
      sVar15 = ZSTD_hashPtr(anchor_1,UVar1,5);
      iVar7 = (int)pBVar5;
      uVar10 = (int)anchor_1 - iVar7;
      uVar3 = pUVar4[sVar15];
      pBStack_278 = pBVar5 + uVar3;
      pUVar4[sVar15] = uVar10;
      UVar11 = MEM_read32(anchor_1 + (1 - (ulong)offsetSaved_1));
      UVar12 = MEM_read32(anchor_1 + 1);
      if (offsetSaved_1 == 0 || UVar11 != UVar12) {
        if (uVar2 < uVar3) {
          UVar11 = MEM_read32(pBStack_278);
          UVar12 = MEM_read32(anchor_1);
          if (UVar11 == UVar12) {
            UVar11 = (int)anchor_1 - (int)pBStack_278;
            sVar15 = ZSTD_count(anchor_1 + 4,pBStack_278 + 4,pBVar13);
            h_1 = sVar15 + 4;
            while( true ) {
              bVar17 = false;
              if (pBStack_1e0 < anchor_1 && pBVar5 + uVar2 < pBStack_278) {
                bVar17 = anchor_1[-1] == pBStack_278[-1];
              }
              if (!bVar17) break;
              anchor_1 = anchor_1 + -1;
              pBStack_278 = pBStack_278 + -1;
              h_1 = h_1 + 1;
            }
            ZSTD_storeSeq(seqStore,(long)anchor_1 - (long)pBStack_1e0,pBStack_1e0,UVar11 + 2,h_1 - 3
                         );
            local_208 = offsetSaved_1;
            offsetSaved_1 = UVar11;
            goto LAB_0069d197;
          }
          anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_1e0 >> 8) + (ulong)uVar8;
        }
        else {
          anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_1e0 >> 8) + (ulong)uVar8;
        }
      }
      else {
        sVar15 = ZSTD_count(anchor_1 + 5,anchor_1 + (5 - (ulong)offsetSaved_1),pBVar13);
        h_1 = sVar15 + 4;
        anchor_1 = anchor_1 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_1 - (long)pBStack_1e0,pBStack_1e0,0,sVar15 + 1);
LAB_0069d197:
        pBStack_1e0 = anchor_1 + h_1;
        anchor_1 = pBStack_1e0;
        if (pBStack_1e0 <= pBVar14) {
          sVar15 = ZSTD_hashPtr(pBVar5 + (ulong)uVar10 + 2,UVar1,5);
          pUVar4[sVar15] = uVar10 + 2;
          sVar15 = ZSTD_hashPtr(pBStack_1e0 + -2,UVar1,5);
          pUVar4[sVar15] = ((int)pBStack_1e0 + -2) - iVar7;
          while( true ) {
            uVar3 = local_208;
            bVar17 = false;
            if (anchor_1 <= pBVar14) {
              UVar11 = MEM_read32(anchor_1);
              UVar12 = MEM_read32(anchor_1 + -(ulong)local_208);
              bVar17 = local_208 != 0 && UVar11 == UVar12;
            }
            pBStack_1e0 = anchor_1;
            if (!bVar17) break;
            sVar15 = ZSTD_count(anchor_1 + 4,anchor_1 + (4 - (ulong)local_208),pBVar13);
            local_208 = offsetSaved_1;
            offsetSaved_1 = uVar3;
            sVar16 = ZSTD_hashPtr(anchor_1,UVar1,5);
            pUVar4[sVar16] = (int)anchor_1 - iVar7;
            ZSTD_storeSeq(seqStore,0,anchor_1,0,sVar15 + 1);
            anchor_1 = anchor_1 + sVar15 + 4;
          }
        }
      }
    }
    if (offsetSaved_1 == 0) {
      local_7a8 = dms_1._4_4_;
    }
    else {
      local_7a8 = offsetSaved_1;
    }
    *rep = local_7a8;
    if (local_208 == 0) {
      local_7ac = dms_1._4_4_;
    }
    else {
      local_7ac = local_208;
    }
    rep[1] = local_7ac;
    ms_local = (ZSTD_matchState_t *)(pBVar13 + -(long)pBStack_1e0);
    break;
  case 6:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar8 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar5 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar13 = (BYTE *)((long)src + srcSize);
    pBVar14 = pBVar13 + -8;
    uVar3 = *rep;
    uVar10 = rep[1];
    dms_2._4_4_ = 0;
    iVar6 = (int)(pBVar5 + uVar2);
    anchor_2 = (BYTE *)((long)src + (long)(int)(uint)(iVar7 == iVar6));
    uVar9 = (int)anchor_2 - iVar6;
    local_378 = uVar10;
    if (uVar9 < uVar10) {
      local_378 = 0;
      dms_2._4_4_ = uVar10;
    }
    offsetSaved_2 = uVar3;
    pBStack_350 = (BYTE *)src;
    if (uVar9 < uVar3) {
      offsetSaved_2 = 0;
      dms_2._4_4_ = uVar3;
    }
    while (anchor_2 < pBVar14) {
      sVar15 = ZSTD_hashPtr(anchor_2,UVar1,6);
      iVar7 = (int)pBVar5;
      uVar10 = (int)anchor_2 - iVar7;
      uVar3 = pUVar4[sVar15];
      pBStack_3e8 = pBVar5 + uVar3;
      pUVar4[sVar15] = uVar10;
      UVar11 = MEM_read32(anchor_2 + (1 - (ulong)offsetSaved_2));
      UVar12 = MEM_read32(anchor_2 + 1);
      if (offsetSaved_2 == 0 || UVar11 != UVar12) {
        if (uVar2 < uVar3) {
          UVar11 = MEM_read32(pBStack_3e8);
          UVar12 = MEM_read32(anchor_2);
          if (UVar11 == UVar12) {
            UVar11 = (int)anchor_2 - (int)pBStack_3e8;
            sVar15 = ZSTD_count(anchor_2 + 4,pBStack_3e8 + 4,pBVar13);
            h_2 = sVar15 + 4;
            while( true ) {
              bVar17 = false;
              if (pBStack_350 < anchor_2 && pBVar5 + uVar2 < pBStack_3e8) {
                bVar17 = anchor_2[-1] == pBStack_3e8[-1];
              }
              if (!bVar17) break;
              anchor_2 = anchor_2 + -1;
              pBStack_3e8 = pBStack_3e8 + -1;
              h_2 = h_2 + 1;
            }
            ZSTD_storeSeq(seqStore,(long)anchor_2 - (long)pBStack_350,pBStack_350,UVar11 + 2,h_2 - 3
                         );
            local_378 = offsetSaved_2;
            offsetSaved_2 = UVar11;
            goto LAB_0069e1c3;
          }
          anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_350 >> 8) + (ulong)uVar8;
        }
        else {
          anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_350 >> 8) + (ulong)uVar8;
        }
      }
      else {
        sVar15 = ZSTD_count(anchor_2 + 5,anchor_2 + (5 - (ulong)offsetSaved_2),pBVar13);
        h_2 = sVar15 + 4;
        anchor_2 = anchor_2 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_2 - (long)pBStack_350,pBStack_350,0,sVar15 + 1);
LAB_0069e1c3:
        pBStack_350 = anchor_2 + h_2;
        anchor_2 = pBStack_350;
        if (pBStack_350 <= pBVar14) {
          sVar15 = ZSTD_hashPtr(pBVar5 + (ulong)uVar10 + 2,UVar1,6);
          pUVar4[sVar15] = uVar10 + 2;
          sVar15 = ZSTD_hashPtr(pBStack_350 + -2,UVar1,6);
          pUVar4[sVar15] = ((int)pBStack_350 + -2) - iVar7;
          while( true ) {
            uVar3 = local_378;
            bVar17 = false;
            if (anchor_2 <= pBVar14) {
              UVar11 = MEM_read32(anchor_2);
              UVar12 = MEM_read32(anchor_2 + -(ulong)local_378);
              bVar17 = local_378 != 0 && UVar11 == UVar12;
            }
            pBStack_350 = anchor_2;
            if (!bVar17) break;
            sVar15 = ZSTD_count(anchor_2 + 4,anchor_2 + (4 - (ulong)local_378),pBVar13);
            local_378 = offsetSaved_2;
            offsetSaved_2 = uVar3;
            sVar16 = ZSTD_hashPtr(anchor_2,UVar1,6);
            pUVar4[sVar16] = (int)anchor_2 - iVar7;
            ZSTD_storeSeq(seqStore,0,anchor_2,0,sVar15 + 1);
            anchor_2 = anchor_2 + sVar15 + 4;
          }
        }
      }
    }
    if (offsetSaved_2 == 0) {
      local_878 = dms_2._4_4_;
    }
    else {
      local_878 = offsetSaved_2;
    }
    *rep = local_878;
    if (local_378 == 0) {
      local_87c = dms_2._4_4_;
    }
    else {
      local_87c = local_378;
    }
    rep[1] = local_87c;
    ms_local = (ZSTD_matchState_t *)(pBVar13 + -(long)pBStack_350);
    break;
  case 7:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar8 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar5 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar13 = (BYTE *)((long)src + srcSize);
    pBVar14 = pBVar13 + -8;
    uVar3 = *rep;
    uVar10 = rep[1];
    dms_3._4_4_ = 0;
    iVar6 = (int)(pBVar5 + uVar2);
    anchor_3 = (BYTE *)((long)src + (long)(int)(uint)(iVar7 == iVar6));
    uVar9 = (int)anchor_3 - iVar6;
    local_4e8 = uVar10;
    if (uVar9 < uVar10) {
      local_4e8 = 0;
      dms_3._4_4_ = uVar10;
    }
    offsetSaved_3 = uVar3;
    pBStack_4c0 = (BYTE *)src;
    if (uVar9 < uVar3) {
      offsetSaved_3 = 0;
      dms_3._4_4_ = uVar3;
    }
    while (anchor_3 < pBVar14) {
      sVar15 = ZSTD_hashPtr(anchor_3,UVar1,7);
      iVar7 = (int)pBVar5;
      uVar10 = (int)anchor_3 - iVar7;
      uVar3 = pUVar4[sVar15];
      pBStack_558 = pBVar5 + uVar3;
      pUVar4[sVar15] = uVar10;
      UVar11 = MEM_read32(anchor_3 + (1 - (ulong)offsetSaved_3));
      UVar12 = MEM_read32(anchor_3 + 1);
      if (offsetSaved_3 == 0 || UVar11 != UVar12) {
        if (uVar2 < uVar3) {
          UVar11 = MEM_read32(pBStack_558);
          UVar12 = MEM_read32(anchor_3);
          if (UVar11 == UVar12) {
            UVar11 = (int)anchor_3 - (int)pBStack_558;
            sVar15 = ZSTD_count(anchor_3 + 4,pBStack_558 + 4,pBVar13);
            h_3 = sVar15 + 4;
            while( true ) {
              bVar17 = false;
              if (pBStack_4c0 < anchor_3 && pBVar5 + uVar2 < pBStack_558) {
                bVar17 = anchor_3[-1] == pBStack_558[-1];
              }
              if (!bVar17) break;
              anchor_3 = anchor_3 + -1;
              pBStack_558 = pBStack_558 + -1;
              h_3 = h_3 + 1;
            }
            ZSTD_storeSeq(seqStore,(long)anchor_3 - (long)pBStack_4c0,pBStack_4c0,UVar11 + 2,h_3 - 3
                         );
            local_4e8 = offsetSaved_3;
            offsetSaved_3 = UVar11;
            goto LAB_0069f1ef;
          }
          anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_4c0 >> 8) + (ulong)uVar8;
        }
        else {
          anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_4c0 >> 8) + (ulong)uVar8;
        }
      }
      else {
        sVar15 = ZSTD_count(anchor_3 + 5,anchor_3 + (5 - (ulong)offsetSaved_3),pBVar13);
        h_3 = sVar15 + 4;
        anchor_3 = anchor_3 + 1;
        ZSTD_storeSeq(seqStore,(long)anchor_3 - (long)pBStack_4c0,pBStack_4c0,0,sVar15 + 1);
LAB_0069f1ef:
        pBStack_4c0 = anchor_3 + h_3;
        anchor_3 = pBStack_4c0;
        if (pBStack_4c0 <= pBVar14) {
          sVar15 = ZSTD_hashPtr(pBVar5 + (ulong)uVar10 + 2,UVar1,7);
          pUVar4[sVar15] = uVar10 + 2;
          sVar15 = ZSTD_hashPtr(pBStack_4c0 + -2,UVar1,7);
          pUVar4[sVar15] = ((int)pBStack_4c0 + -2) - iVar7;
          while( true ) {
            uVar3 = local_4e8;
            bVar17 = false;
            if (anchor_3 <= pBVar14) {
              UVar11 = MEM_read32(anchor_3);
              UVar12 = MEM_read32(anchor_3 + -(ulong)local_4e8);
              bVar17 = local_4e8 != 0 && UVar11 == UVar12;
            }
            pBStack_4c0 = anchor_3;
            if (!bVar17) break;
            sVar15 = ZSTD_count(anchor_3 + 4,anchor_3 + (4 - (ulong)local_4e8),pBVar13);
            local_4e8 = offsetSaved_3;
            offsetSaved_3 = uVar3;
            sVar16 = ZSTD_hashPtr(anchor_3,UVar1,7);
            pUVar4[sVar16] = (int)anchor_3 - iVar7;
            ZSTD_storeSeq(seqStore,0,anchor_3,0,sVar15 + 1);
            anchor_3 = anchor_3 + sVar15 + 4;
          }
        }
      }
    }
    if (offsetSaved_3 == 0) {
      local_948 = dms_3._4_4_;
    }
    else {
      local_948 = offsetSaved_3;
    }
    *rep = local_948;
    if (local_4e8 == 0) {
      local_94c = dms_3._4_4_;
    }
    else {
      local_94c = local_4e8;
    }
    rep[1] = local_94c;
    ms_local = (ZSTD_matchState_t *)(pBVar13 + -(long)pBStack_4c0);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}